

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

QWidgetList * __thiscall
QAbstractScrollAreaScrollBarContainer::widgets
          (QAbstractScrollAreaScrollBarContainer *this,LogicalPosition position)

{
  int iVar1;
  long *plVar2;
  int in_EDX;
  long in_RSI;
  QAbstractScrollAreaScrollBarContainer *in_RDI;
  int i_1;
  int layoutItemCount;
  int i;
  int scrollBarIndex;
  QWidgetList *list;
  parameter_type in_stack_ffffffffffffffb8;
  int local_28;
  int local_20;
  uint3 in_stack_ffffffffffffffe8;
  uint uVar3;
  
  uVar3 = (uint)in_stack_ffffffffffffffe8;
  *(undefined1 **)&in_RDI->super_QWidget = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->super_QWidget).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->super_QWidget).super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
  QList<QWidget_*>::QList((QList<QWidget_*> *)0x495117);
  local_28 = scrollBarLayoutIndex(in_RDI);
  if (in_EDX == 1) {
    QList<QWidget_*>::reserve((QList<QWidget_*> *)CONCAT44(1,uVar3),_i);
    for (local_20 = 0; local_20 < local_28; local_20 = local_20 + 1) {
      plVar2 = (long *)(**(code **)(**(long **)(in_RSI + 0x30) + 0xa8))
                                 (*(long **)(in_RSI + 0x30),local_20);
      (**(code **)(*plVar2 + 0x68))();
      QList<QWidget_*>::append((QList<QWidget_*> *)0x495179,in_stack_ffffffffffffffb8);
    }
  }
  else if (in_EDX == 2) {
    iVar1 = (**(code **)(**(long **)(in_RSI + 0x30) + 200))();
    QList<QWidget_*>::reserve((QList<QWidget_*> *)CONCAT44(in_EDX,uVar3),_i);
    while (local_28 = local_28 + 1, local_28 < iVar1) {
      plVar2 = (long *)(**(code **)(**(long **)(in_RSI + 0x30) + 0xa8))
                                 (*(long **)(in_RSI + 0x30),local_28);
      (**(code **)(*plVar2 + 0x68))();
      QList<QWidget_*>::append((QList<QWidget_*> *)0x495207,in_stack_ffffffffffffffb8);
    }
  }
  return (QWidgetList *)in_RDI;
}

Assistant:

QWidgetList QAbstractScrollAreaScrollBarContainer::widgets(LogicalPosition position)
{
    QWidgetList list;
    const int scrollBarIndex = scrollBarLayoutIndex();
    if (position == LogicalLeft) {
        list.reserve(scrollBarIndex);
        for (int i = 0; i < scrollBarIndex; ++i)
            list.append(layout->itemAt(i)->widget());
    } else if (position == LogicalRight) {
        const int layoutItemCount = layout->count();
        list.reserve(layoutItemCount - (scrollBarIndex + 1));
        for (int i = scrollBarIndex + 1; i < layoutItemCount; ++i)
            list.append(layout->itemAt(i)->widget());
    }
    return list;
}